

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O0

void dump_bf(Bframe *bf)

{
  LispPTR LVar1;
  Bframe *local_18;
  DLword *ptr;
  Bframe *bf_local;
  
  printf("\n*** Basic Frame");
  if (*(ushort *)&bf->field_0x2 >> 0xd == 4) {
    if ((*(ushort *)&bf->field_0x2 >> 9 & 1) == 0) {
      local_18 = (Bframe *)NativeAligned2FromStackOffset(bf->ivar);
      if ((0x200 < (long)bf - (long)local_18 >> 1) || (((ulong)local_18 & 1) != 0)) {
        printf("\nInvalid basic frame");
        return;
      }
      for (; local_18 < bf; local_18 = local_18 + 1) {
        LVar1 = LAddrFromNative(local_18);
        printf("\n %x : %x %x",(ulong)LVar1,(ulong)*(ushort *)((ulong)local_18 ^ 2),
               (ulong)*(ushort *)((ulong)&local_18->field_0x2 ^ 2));
        print((uint)local_18->ivar);
      }
    }
    LVar1 = LAddrFromNative(bf);
    printf("\n %x : %x %x ",(ulong)LVar1,(ulong)bf->ivar,(ulong)*(ushort *)&bf->field_0x2);
    putchar(0x5b);
    if ((*(ushort *)&bf->field_0x2 >> 9 & 1) != 0) {
      printf("Residual, ");
    }
    if ((*(ushort *)&bf->field_0x2 >> 8 & 1) != 0) {
      printf("Padded, ");
    }
    printf("usecnt=%d ] ",(ulong)(*(ushort *)&bf->field_0x2 & 0xff));
    printf("ivar : 0x%x",(ulong)bf->ivar);
  }
  else {
    printf("\nInvalid basic frame");
  }
  return;
}

Assistant:

void dump_bf(Bframe *bf) {
  DLword *ptr;
  printf("\n*** Basic Frame");
  if (BFRAMEPTR(bf)->flags != 4) {
    printf("\nInvalid basic frame");
    return;
  }

  if (BFRAMEPTR(bf)->residual) { goto printflags; }

  ptr = NativeAligned2FromStackOffset(bf->ivar);
  if ((((DLword *)bf - ptr) > 512) || (((UNSIGNED)ptr & 1) != 0)) {
    printf("\nInvalid basic frame");
    return;
  }
  while (ptr < (DLword *)bf) {
    printf("\n %x : %x %x", LAddrFromNative(ptr), GETWORD(ptr), GETWORD(ptr + 1));
    print(*ptr);
    ptr += 2;
  }

printflags:
  printf("\n %x : %x %x ", LAddrFromNative(bf), *(DLword *)bf, *((DLword *)bf + 1));
  putchar('[');
  if (BFRAMEPTR(bf)->residual) printf("Residual, ");
  if (BFRAMEPTR(bf)->padding) printf("Padded, ");
  printf("usecnt=%d ] ", BFRAMEPTR(bf)->usecnt);
  printf("ivar : 0x%x", BFRAMEPTR(bf)->ivar);
}